

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ToInt64(JSContext *ctx,int64_t *pres,JSValue val)

{
  JSToNumberHintEnum flag;
  uint uVar1;
  int iVar2;
  JSValueUnion JVar3;
  long lVar4;
  int64_t iVar5;
  JSValue val_00;
  JSValue JVar6;
  
  iVar5 = val.tag;
  JVar3 = val.u;
  if (0xfffffff4 < (uint)val.tag) {
    *(int *)JVar3.ptr = *JVar3.ptr + 1;
  }
  JVar6.tag = (int64_t)JVar3.ptr;
  JVar6.u.float64 = JVar3.float64;
  do {
    JVar3 = JVar6.u;
    flag = (JSToNumberHintEnum)iVar5;
    if (flag < 4) {
      iVar5 = (int64_t)JVar6.u._0_4_;
LAB_00122ea0:
      iVar2 = 0;
      goto LAB_00122ea2;
    }
    if (flag == 7) {
      uVar1 = JVar6.u._4_4_ >> 0x14 & 0x7ff;
      if (uVar1 < 0x43e) {
        iVar5 = (int64_t)JVar3.float64;
        goto LAB_00122ea0;
      }
      iVar2 = 0;
      if (uVar1 < 0x473) {
        lVar4 = ((ulong)JVar3.ptr & 0xfffffffffffff) + 0x10000000000000 <<
                ((char)uVar1 - 0x33U & 0x3f);
        iVar5 = -lVar4;
        if (-1 < (long)JVar3.ptr) {
          iVar5 = lVar4;
        }
      }
      else {
        iVar5 = 0;
      }
      goto LAB_00122ea2;
    }
    val_00.tag = iVar5;
    val_00.u.float64 = JVar3.float64;
    JVar6 = JS_ToNumberHintFree(ctx,val_00,flag);
    iVar5 = JVar6.tag;
  } while ((int)JVar6.tag != 6);
  iVar2 = -1;
  iVar5 = 0;
LAB_00122ea2:
  *pres = iVar5;
  return iVar2;
}

Assistant:

int JS_ToInt64(JSContext *ctx, int64_t *pres, JSValueConst val)
{
    return JS_ToInt64Free(ctx, pres, JS_DupValue(ctx, val));
}